

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form8_Histogram(HistogramForm8 Histogram)

{
  ImageTemplate<unsigned_char> *this;
  uint8_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  ushort uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  uint uVar17;
  undefined1 auVar18 [64];
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  uint32_t roiWidth;
  uint32_t roiHeight;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  Image local_50;
  
  Unit_Test::intensityArray(&intensity,2);
  uVar1 = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&roiY,0,0,'\x01','\x01');
  Test_Helper::uniformImage((Image *)&roiX,uVar1,0,0,(Image *)&roiY);
  uVar1 = intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[1];
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&histogram,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_50,uVar1,0,0,(Image *)&histogram);
  __l._M_len = 2;
  __l._M_array = (iterator)&roiX;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(&image,__l,(allocator_type *)&roiWidth);
  lVar8 = 0x28;
  do {
    this = (ImageTemplate<unsigned_char> *)
           ((long)&roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar8);
    this->_vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(this);
    lVar8 = lVar8 + -0x28;
  } while (lVar8 != -0x28);
  histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)&histogram);
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)&roiY);
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Unit_Test::generateRoi(&image,&roiX,&roiY,&roiWidth,&roiHeight);
  bVar9 = true;
  if (1 < roiHeight) {
    Unit_Test::fillImage
              (image.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,
               roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1],
               roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1],roiWidth,roiHeight >> 1,0xff);
    Unit_Test::fillImage
              (image.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,
               roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1],
               (roiHeight >> 1) +
               roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1],roiWidth,roiHeight - (roiHeight >> 1),'\0');
    histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*Histogram)(image.
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 *roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 *roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 image.
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1,
                 roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[1],
                 roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[1],roiWidth,roiHeight,&histogram);
    if ((long)histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start == 0x400) {
      uVar7 = (roiHeight >> 1) * roiWidth;
      bVar9 = false;
      uVar17 = 0;
      if (histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start
          [*intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start] == uVar7) {
        if (histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          auVar12 = vpbroadcastq_avx512f();
          auVar12 = vpsrlq_avx512f(auVar12,2);
          auVar18 = ZEXT1664((undefined1  [16])0x0);
          lVar8 = 0;
          auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          do {
            auVar15 = vmovdqa64_avx512f(auVar18);
            auVar18 = vpbroadcastq_avx512f();
            auVar16 = vporq_avx512f(auVar18,auVar13);
            auVar18 = vporq_avx512f(auVar18,auVar14);
            uVar4 = vpcmpuq_avx512f(auVar18,auVar12,2);
            bVar5 = (byte)uVar4;
            uVar4 = vpcmpuq_avx512f(auVar16,auVar12,2);
            bVar6 = (byte)uVar4;
            uVar10 = CONCAT11(bVar6,bVar5);
            auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                         (histogram.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar8));
            auVar16._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar18._4_4_;
            auVar16._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_;
            auVar16._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar18._8_4_;
            auVar16._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar18._12_4_;
            auVar16._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar18._16_4_;
            auVar16._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar18._20_4_;
            auVar16._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar18._24_4_;
            auVar16._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar18._28_4_;
            auVar16._32_4_ = (uint)(bVar6 & 1) * auVar18._32_4_;
            auVar16._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar18._36_4_;
            auVar16._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar18._40_4_;
            auVar16._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar18._44_4_;
            auVar16._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar18._48_4_;
            auVar16._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar18._52_4_;
            auVar16._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar18._56_4_;
            auVar16._60_4_ = (uint)(bVar6 >> 7) * auVar18._60_4_;
            auVar18 = vpaddd_avx512f(auVar16,auVar15);
            lVar8 = lVar8 + 0x10;
          } while (lVar8 != 0x100);
          auVar12 = vmovdqa32_avx512f(auVar18);
          auVar13._0_4_ =
               (uint)(bVar5 & 1) * auVar12._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar15._0_4_;
          bVar9 = (bool)((byte)(uVar10 >> 1) & 1);
          auVar13._4_4_ = (uint)bVar9 * auVar12._4_4_ | (uint)!bVar9 * auVar15._4_4_;
          bVar9 = (bool)((byte)(uVar10 >> 2) & 1);
          auVar13._8_4_ = (uint)bVar9 * auVar12._8_4_ | (uint)!bVar9 * auVar15._8_4_;
          bVar9 = (bool)((byte)(uVar10 >> 3) & 1);
          auVar13._12_4_ = (uint)bVar9 * auVar12._12_4_ | (uint)!bVar9 * auVar15._12_4_;
          bVar9 = (bool)((byte)(uVar10 >> 4) & 1);
          auVar13._16_4_ = (uint)bVar9 * auVar12._16_4_ | (uint)!bVar9 * auVar15._16_4_;
          bVar9 = (bool)((byte)(uVar10 >> 5) & 1);
          auVar13._20_4_ = (uint)bVar9 * auVar12._20_4_ | (uint)!bVar9 * auVar15._20_4_;
          bVar9 = (bool)((byte)(uVar10 >> 6) & 1);
          auVar13._24_4_ = (uint)bVar9 * auVar12._24_4_ | (uint)!bVar9 * auVar15._24_4_;
          bVar9 = (bool)((byte)(uVar10 >> 7) & 1);
          auVar13._28_4_ = (uint)bVar9 * auVar12._28_4_ | (uint)!bVar9 * auVar15._28_4_;
          auVar13._32_4_ =
               (uint)(bVar6 & 1) * auVar12._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar15._32_4_;
          bVar9 = (bool)(bVar6 >> 1 & 1);
          auVar13._36_4_ = (uint)bVar9 * auVar12._36_4_ | (uint)!bVar9 * auVar15._36_4_;
          bVar9 = (bool)(bVar6 >> 2 & 1);
          auVar13._40_4_ = (uint)bVar9 * auVar12._40_4_ | (uint)!bVar9 * auVar15._40_4_;
          bVar9 = (bool)(bVar6 >> 3 & 1);
          auVar13._44_4_ = (uint)bVar9 * auVar12._44_4_ | (uint)!bVar9 * auVar15._44_4_;
          bVar9 = (bool)(bVar6 >> 4 & 1);
          auVar13._48_4_ = (uint)bVar9 * auVar12._48_4_ | (uint)!bVar9 * auVar15._48_4_;
          bVar9 = (bool)(bVar6 >> 5 & 1);
          auVar13._52_4_ = (uint)bVar9 * auVar12._52_4_ | (uint)!bVar9 * auVar15._52_4_;
          bVar9 = (bool)(bVar6 >> 6 & 1);
          auVar13._56_4_ = (uint)bVar9 * auVar12._56_4_ | (uint)!bVar9 * auVar15._56_4_;
          auVar13._60_4_ =
               (uint)(bVar6 >> 7) * auVar12._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar15._60_4_;
          auVar11 = vextracti64x4_avx512f(auVar13,1);
          auVar12 = vpaddd_avx512f(auVar13,ZEXT3264(auVar11));
          auVar2 = vpaddd_avx(auVar12._0_16_,auVar12._16_16_);
          auVar3 = vpshufd_avx(auVar2,0xee);
          auVar2 = vpaddd_avx(auVar2,auVar3);
          auVar3 = vpshufd_avx(auVar2,0x55);
          auVar2 = vpaddd_avx(auVar2,auVar3);
          uVar17 = auVar2._0_4_;
        }
        bVar9 = uVar17 == uVar7;
      }
    }
    else {
      bVar9 = false;
    }
    if (histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&image);
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar9;
}

Assistant:

bool form8_Histogram(HistogramForm8 Histogram)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > image = { uniformImage( intensity[0] ), uniformImage( intensity[1] ) };

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        if ( roiHeight / 2 == 0 )
            return true;

        fillImage( image[1], roiX[1], roiY[1], roiWidth, roiHeight / 2, 255 );
        fillImage( image[1], roiX[1], roiY[1] + roiHeight / 2, roiWidth, roiHeight - roiHeight / 2, 0 );

        std::vector < uint32_t > histogram;
        Histogram( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], roiWidth, roiHeight, histogram );

        return histogram.size() == 256u && histogram[intensity[0]] == roiWidth * (roiHeight / 2) &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == roiWidth * (roiHeight / 2);
    }